

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod_set.c
# Opt level: O0

char * acmod_set_id2name(acmod_set_t *acmod_set,acmod_id_t id)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  word_posn_t local_38;
  acmod_id_t local_34;
  word_posn_t posn;
  acmod_id_t right;
  acmod_id_t left;
  acmod_id_t base;
  char *pmap;
  acmod_set_t *paStack_18;
  acmod_id_t id_local;
  acmod_set_t *acmod_set_local;
  
  _left = "besiu";
  if (id < acmod_set->n_ci) {
    acmod_set_local = (acmod_set_t *)acmod_set->ci[id].name;
  }
  else if (id < acmod_set->next_id) {
    pmap._4_4_ = id;
    paStack_18 = acmod_set;
    acmod_set_id2tri(acmod_set,&right,&posn,&local_34,&local_38,id);
    pcVar1 = acmod_set_id2name(paStack_18,right);
    pcVar2 = acmod_set_id2name(paStack_18,posn);
    pcVar3 = acmod_set_id2name(paStack_18,local_34);
    sprintf(acmod_set_id2name::str,"%s %s %s %c",pcVar1,pcVar2,pcVar3,
            (ulong)(uint)(int)_left[(int)local_38]);
    acmod_set_local = (acmod_set_t *)acmod_set_id2name::str;
  }
  else {
    acmod_set_local = (acmod_set_t *)0x0;
  }
  return (char *)acmod_set_local;
}

Assistant:

const char *
acmod_set_id2name(acmod_set_t *acmod_set,
		  acmod_id_t id)
{
    static char str[1024];
    char *pmap = WORD_POSN_CHAR_MAP;
    acmod_id_t base;
    acmod_id_t left;
    acmod_id_t right;
    word_posn_t posn;

    if (id < acmod_set->n_ci)
	return acmod_set->ci[id].name;

    else if (id < acmod_set->next_id) {

	acmod_set_id2tri(acmod_set, &base, &left, &right, &posn, id);

	sprintf(str, "%s %s %s %c",
		acmod_set_id2name(acmod_set, base),
		acmod_set_id2name(acmod_set, left),
		acmod_set_id2name(acmod_set, right),
		pmap[(int)posn]);
	
	return str;
    }
    else
	return NULL;
}